

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint32_t local_7c;
  uint local_4c;
  undefined8 uStack_48;
  uint32_t cur;
  uint32_t reps [4];
  uint local_30;
  uint32_t len_end;
  uint32_t position_local;
  uint32_t *len_res_local;
  uint32_t *back_res_local;
  lzma_mf *mf_local;
  lzma_lzma1_encoder *coder_local;
  
  if (coder->opts_end_index == coder->opts_current_index) {
    if (mf->read_ahead == 0) {
      if (0x7f < coder->match_price_count) {
        fill_dist_prices(coder);
      }
      if (0xf < coder->align_price_count) {
        fill_align_prices(coder);
      }
    }
    local_30 = helper1(coder,mf,back_res,len_res,position);
    if (local_30 != 0xffffffff) {
      uStack_48 = *(undefined8 *)coder->reps;
      reps._0_8_ = *(undefined8 *)(coder->reps + 2);
      for (local_4c = 1; local_4c < local_30; local_4c = local_4c + 1) {
        if (0xfff < local_4c) {
          __assert_fail("cur < OPTS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                        ,0x34c,
                        "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                       );
        }
        uVar1 = lzma_mf_find(mf,&coder->matches_count,coder->matches);
        coder->longest_match_length = uVar1;
        if (mf->nice_len <= coder->longest_match_length) break;
        puVar3 = mf_ptr(mf);
        uVar1 = mf->nice_len;
        uVar2 = mf_avail(mf);
        if (uVar2 + 1 < 0xfff - local_4c) {
          local_7c = mf_avail(mf);
          local_7c = local_7c + 1;
        }
        else {
          local_7c = 0xfff - local_4c;
        }
        local_30 = helper2(coder,(uint32_t *)&stack0xffffffffffffffb8,puVar3 + -1,local_30,
                           position + local_4c,local_4c,uVar1,local_7c);
      }
      backward(coder,len_res,back_res,local_4c);
    }
  }
  else {
    if (mf->read_ahead == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x32b,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    *len_res = coder->opts[coder->opts_current_index].pos_prev - coder->opts_current_index;
    *back_res = coder->opts[coder->opts_current_index].back_prev;
    coder->opts_current_index = coder->opts[coder->opts_current_index].pos_prev;
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}